

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  int iVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  char *pcVar3;
  undefined1 uVar4;
  string se;
  char *local_1b8 [4];
  ostringstream e;
  
  if (this->AppendMode == true) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(this_00,(this->MainImportFile)._M_dataplus._M_p,_S_app);
  }
  else {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream
              (this_00,(this->MainImportFile)._M_dataplus._M_p,true);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
  }
  if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)this_00,"# Generated by CMake ");
    pcVar3 = cmVersion::GetCMakeVersion();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n\n");
    poVar2 = std::operator<<((ostream *)this_00,
                             "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n");
    poVar2 = std::operator<<(poVar2,"   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n");
    std::operator<<(poVar2,"endif()\n");
    poVar2 = std::operator<<((ostream *)this_00,"cmake_policy(PUSH)\n");
    std::operator<<(poVar2,"cmake_policy(VERSION 2.6)\n");
    std::__cxx11::string::string((string *)&e,"",(allocator *)&se);
    GenerateImportHeaderCode(this,(ostream *)this_00,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    iVar1 = (*this->_vptr_cmExportFileGenerator[2])(this,this_00);
    uVar4 = (undefined1)iVar1;
    GenerateImportFooterCode(this,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"cmake_policy(POP)\n");
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->MainImportFile);
    poVar2 = std::operator<<(poVar2,"\": ");
    std::operator<<(poVar2,(string *)&se);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_1b8[0],(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::__cxx11::string::~string((string *)&se);
    uVar4 = 0;
  }
  (*(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_00);
  return (bool)uVar4;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  cmsys::auto_ptr<cmsys::ofstream> foutPtr;
  if(this->AppendMode)
    {
    // Open for append.
    cmsys::auto_ptr<cmsys::ofstream>
      ap(new cmsys::ofstream(this->MainImportFile.c_str(), std::ios::app));
    foutPtr = ap;
    }
  else
    {
    // Generate atomically and with copy-if-different.
    cmsys::auto_ptr<cmGeneratedFileStream>
      ap(new cmGeneratedFileStream(this->MainImportFile.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
    }
  if(!foutPtr.get() || !*foutPtr)
    {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile
      << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  std::ostream& os = *foutPtr;

  // Protect that file against use with older CMake versions.
  os << "# Generated by CMake " << cmVersion::GetCMakeVersion() << "\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n"
     << "endif()\n";

  // Isolate the file policy level.
  // We use 2.6 here instead of the current version because newer
  // versions of CMake should be able to export files imported by 2.6
  // until the import format changes.
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION 2.6)\n";

  // Start with the import file header.
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  os << "cmake_policy(POP)\n";

  return result;
}